

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

EnumVar * __thiscall
kratos::Generator::enum_var(Generator *this,string *var_name,shared_ptr<kratos::Enum> *enum_def)

{
  bool bVar1;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  IRNode *local_80;
  undefined1 local_78 [8];
  shared_ptr<kratos::EnumVar> p;
  undefined1 local_58 [24];
  pointer ppStack_40;
  allocator_type local_29;
  
  bVar1 = has_var(this,var_name);
  if (!bVar1) {
    local_58._16_8_ = this;
    std::
    make_shared<kratos::EnumVar,kratos::Generator*,std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>const&>
              ((Generator **)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_58 + 0x10),(shared_ptr<kratos::Enum> *)var_name);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumVar>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)&this->vars_,var_name,(shared_ptr<kratos::EnumVar> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    return (EnumVar *)local_78;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_58._16_8_ = (var_name->_M_dataplus)._M_p;
  ppStack_40 = (pointer)var_name->_M_string_length;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0} already exists");
  format_str.data_ = (char *)bVar2.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)(local_58 + 0x10);
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_78,(detail *)bVar2.data_,format_str,args);
  get_var((Generator *)local_58,(string *)this);
  local_80 = (IRNode *)local_58._0_8_;
  __l._M_len = 1;
  __l._M_array = &local_80;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
             (local_58 + 0x10),__l,&local_29);
  VarException::VarException
            (this_00,(string *)local_78,
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
             (local_58 + 0x10));
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EnumVar &Generator::enum_var(const std::string &var_name, const std::shared_ptr<Enum> &enum_def) {
    if (has_var(var_name))
        throw VarException(::format("{0} already exists", var_name), {get_var(var_name).get()});
    auto p = std::make_shared<EnumVar>(this, var_name, enum_def);
    vars_.emplace(var_name, p);
    return *p;
}